

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::Calendar(Calendar *this,TimeZone *zone,Locale *aLocale,UErrorCode *success)

{
  UBool UVar1;
  UErrorCode *success_local;
  Locale *aLocale_local;
  TimeZone *zone_local;
  Calendar *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Calendar_005b6bd8;
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  this->fNextStamp = 2;
  this->fTime = 0.0;
  this->fLenient = '\x01';
  this->fZone = (TimeZone *)0x0;
  this->fRepeatedWallTime = UCAL_WALLTIME_LAST;
  this->fSkippedWallTime = UCAL_WALLTIME_LAST;
  this->validLocale[0] = '\0';
  this->actualLocale[0] = '\0';
  UVar1 = ::U_FAILURE(*success);
  if (UVar1 == '\0') {
    if (zone == (TimeZone *)0x0) {
      *success = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      clear(this);
      this->fZone = zone;
      setWeekData(this,aLocale,(char *)0x0,success);
    }
  }
  return;
}

Assistant:

Calendar::Calendar(TimeZone* zone, const Locale& aLocale, UErrorCode& success)
:   UObject(),
fIsTimeSet(FALSE),
fAreFieldsSet(FALSE),
fAreAllFieldsSet(FALSE),
fAreFieldsVirtuallySet(FALSE),
fNextStamp((int32_t)kMinimumUserStamp),
fTime(0),
fLenient(TRUE),
fZone(NULL),
fRepeatedWallTime(UCAL_WALLTIME_LAST),
fSkippedWallTime(UCAL_WALLTIME_LAST)
{
    validLocale[0] = 0;
    actualLocale[0] = 0;
    if (U_FAILURE(success)) {
        return;
    }
    if(zone == 0) {
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: ILLEGAL ARG because timezone cannot be 0\n",
            __FILE__, __LINE__);
#endif
        success = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    clear();
    fZone = zone;
    setWeekData(aLocale, NULL, success);
}